

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::MultAdd
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,TPZFMatrix<double> *x,
          TPZFMatrix<double> *y,TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  size_type sVar4;
  TPZFMatrix<double> *pTVar5;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<double> *in_RSI;
  TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *in_RDI;
  int in_R8D;
  TPZFMatrix<double> *unaff_retaddr;
  TPZFMatrix<double> *in_stack_00000008;
  TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *in_stack_00000010;
  int64_t ic;
  int64_t xcols;
  int i;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> data;
  TPZFMatrix<double> *Residual_local;
  int isub;
  const_iterator it;
  TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> v2work;
  TPZAutoPointer<TPZDohrAssembleList<double>_> assemblelist;
  TPZDohrPrecondThreadV1Data<double,_TPZDohrSubstructCondense<double>_> v1threaddata;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZFMatrix<double> v2;
  TPZFMatrix<double> v1;
  int64_t c;
  int64_t cols;
  int64_t rows;
  TPZSimpleTimer precondi;
  undefined4 in_stack_000003d0;
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  *in_stack_fffffffffffffbf8;
  TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *in_stack_fffffffffffffc00;
  double in_stack_fffffffffffffc08;
  TPZSimpleTimer *in_stack_fffffffffffffc10;
  TPZDohrAssembleList<double> *in_stack_fffffffffffffc18;
  TPZFMatrix<double> *in_stack_fffffffffffffc20;
  TPZFMatrix<double> *this_00;
  undefined8 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  reference in_stack_fffffffffffffc38;
  TPZFMatrix<double> *in_stack_fffffffffffffc40;
  TPZMatrix<double> *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  TPZFMatrix<double> *in_stack_fffffffffffffc58;
  TPZFMatrix<double> *in_stack_fffffffffffffc60;
  long local_320;
  int local_2ec;
  _Self local_2b8;
  _List_node_base *local_2b0;
  int local_2a4;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> local_2a0 [10];
  undefined1 local_249;
  TPZAutoPointer<TPZDohrAssembleList<double>_> local_240;
  TPZDohrPrecondThreadV1Data<double,_TPZDohrSubstructCondense<double>_> *local_238;
  TPZDohrPrecondThreadV1Data<double,_TPZDohrSubstructCondense<double>_> local_228;
  pointer in_stack_fffffffffffffdf8;
  pointer in_stack_fffffffffffffe00;
  TPZSimpleTimer *in_stack_ffffffffffffff00;
  long local_c0;
  
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 == iVar3) goto LAB_01f8007d;
LAB_01f800af:
    TPZMatrix<double>::Error((char *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
  }
  else {
LAB_01f8007d:
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_01f800af;
  }
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    iVar3 = TPZBaseMatrix::Cols(in_RCX);
    if (iVar2 == iVar3) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
      iVar3 = TPZBaseMatrix::Rows(in_RDX);
      if (iVar2 == iVar3) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
        iVar3 = TPZBaseMatrix::Rows(in_RCX);
        if (iVar2 == iVar3) goto LAB_01f8019b;
      }
    }
  }
  TPZMatrix<double>::Error((char *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
LAB_01f8019b:
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)in_stack_fffffffffffffc20);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  TPZMatrix<double>::PrepareZ
            (&in_stack_fffffffffffffc60->super_TPZMatrix<double>,in_stack_fffffffffffffc58,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (double)in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (double *)in_stack_fffffffffffffc48);
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffc60,(int64_t)in_stack_fffffffffffffc58,
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (double *)in_stack_fffffffffffffc48);
  if (in_RDI->fNumThreads < 1) {
    ComputeV1(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    ComputeV2((TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *)
              CONCAT44(opt,in_stack_000003d0),(TPZFMatrix<double> *)precondi._88_8_,
              (TPZFMatrix<double> *)precondi.fNestedTimersInfo.field_2._8_8_);
  }
  else {
    std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1f803a0);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc20,
               (size_type)in_stack_fffffffffffffc18,(allocator_type *)in_stack_fffffffffffffc10);
    std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1f803c6);
    TPZDohrPrecondThreadV1Data<double,_TPZDohrSubstructCondense<double>_>::
    TPZDohrPrecondThreadV1Data
              (&local_228,in_RDI,in_RSI,(TPZFMatrix<double> *)&stack0xfffffffffffffeb0);
    local_238 = &local_228;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<double,TPZDohrSubstructCondense<double>>*,void>
              ((thread *)in_stack_fffffffffffffc40,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc38,
               (TPZDohrPrecondThreadV1Data<double,_TPZDohrSubstructCondense<double>_> **)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdf8,0);
    std::thread::operator=((thread *)in_stack_fffffffffffffc00,(thread *)in_stack_fffffffffffffbf8);
    std::thread::~thread((thread *)0x1f8044b);
    operator_new(0xe0);
    local_249 = 1;
    sVar4 = std::__cxx11::
            list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
            ::size((list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                    *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc54 = (undefined4)sVar4;
    TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_stack_fffffffffffffc00,
               (TPZAutoPointer<TPZDohrAssembly<double>_> *)in_stack_fffffffffffffbf8);
    TPZDohrAssembleList<double>::TPZDohrAssembleList
              ((TPZDohrAssembleList<double> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),in_stack_fffffffffffffc40,
               (TPZAutoPointer<TPZDohrAssembly<double>_> *)in_stack_fffffffffffffc38);
    local_249 = 0;
    TPZAutoPointer<TPZDohrAssembleList<double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<double>_> *)in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc18);
    TPZAutoPointer<TPZDohrAssembly<double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_stack_fffffffffffffc00);
    TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::
    TPZDohrPrecondV2SubDataList
              ((TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *)
               in_stack_fffffffffffffc20,
               (TPZAutoPointer<TPZDohrAssembleList<double>_> *)in_stack_fffffffffffffc18);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::
    _List_const_iterator(local_2a0);
    local_2a4 = 0;
    local_2b0 = (_List_node_base *)
                std::__cxx11::
                list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                ::begin(in_stack_fffffffffffffbf8);
    local_2a0[0]._M_node = local_2b0;
    while( true ) {
      local_2b8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
           ::end(in_stack_fffffffffffffbf8);
      bVar1 = std::operator!=(local_2a0,&local_2b8);
      if (!bVar1) break;
      in_stack_fffffffffffffc48 = (TPZMatrix<double> *)operator_new(0x90);
      TPZFMatrix<double>::TPZFMatrix
                ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30)
                );
      in_stack_fffffffffffffc40 =
           (TPZFMatrix<double> *)
           TPZAutoPointer<TPZDohrAssembly<double>_>::operator->(&in_RDI->fAssemble);
      TPZDohrAssembly<double>::Extract
                ((TPZDohrAssembly<double> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20,
                 (TPZFMatrix<double> *)in_stack_fffffffffffffc18);
      in_stack_fffffffffffffc34 = local_2a4;
      in_stack_fffffffffffffc38 =
           std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator*
                     ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> *)
                      in_stack_fffffffffffffc00);
      TPZAutoPointer<TPZFMatrix<double>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<double>_> *)in_stack_fffffffffffffc20,
                 (TPZFMatrix<double> *)in_stack_fffffffffffffc18);
      TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::TPZDohrPrecondV2SubData
                ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 (TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffc40,
                 (TPZAutoPointer<TPZFMatrix<double>_> *)in_stack_fffffffffffffc38);
      TPZAutoPointer<TPZFMatrix<double>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<double>_> *)in_stack_fffffffffffffc00);
      TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::AddItem
                ((TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *)
                 in_stack_fffffffffffffc20,
                 (TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *)
                 in_stack_fffffffffffffc18);
      TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::~TPZDohrPrecondV2SubData
                ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *)
                 in_stack_fffffffffffffc00);
      std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator++
                (local_2a0,0);
      local_2a4 = local_2a4 + 1;
    }
    for (local_2ec = 0; local_2ec < in_RDI->fNumThreads; local_2ec = local_2ec + 1) {
      std::thread::
      thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<double,TPZDohrSubstructCondense<double>>*,void>
                ((thread *)in_stack_fffffffffffffc40,
                 (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc38,
                 (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> **)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdf8,
                 (long)(local_2ec + 2));
      std::thread::operator=
                ((thread *)in_stack_fffffffffffffc00,(thread *)in_stack_fffffffffffffbf8);
      std::thread::~thread((thread *)0x1f80843);
    }
    TPZAutoPointer<TPZDohrAssembleList<double>_>::operator->(&local_240);
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<double>*,void>
              ((thread *)in_stack_fffffffffffffc40,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc38,
               (TPZDohrAssembleList<double> **)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdf8,1);
    std::thread::operator=((thread *)in_stack_fffffffffffffc00,(thread *)in_stack_fffffffffffffbf8);
    std::thread::~thread((thread *)0x1f808c7);
    for (local_2ec = 0; local_2ec < in_RDI->fNumThreads + 2; local_2ec = local_2ec + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdf8,
                 (long)local_2ec);
      std::thread::join();
    }
    TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::
    ~TPZDohrPrecondV2SubDataList(in_stack_fffffffffffffc00);
    TPZAutoPointer<TPZDohrAssembleList<double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<double>_> *)in_stack_fffffffffffffc00);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc10);
  }
  TPZFMatrix<double>::operator+=
            ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             in_stack_fffffffffffffc48);
  pTVar5 = (TPZFMatrix<double> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  this_00 = pTVar5;
  for (local_320 = 0; local_320 < (long)pTVar5; local_320 = local_320 + 1) {
    for (local_c0 = 0; local_c0 < iVar2; local_c0 = local_c0 + 1) {
      in_stack_fffffffffffffc18 =
           (TPZDohrAssembleList<double> *)
           TPZFMatrix<double>::operator()
                     (this_00,(int64_t)in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10)
      ;
      in_stack_fffffffffffffc08 = *(double *)in_stack_fffffffffffffc18;
      in_stack_fffffffffffffc10 =
           (TPZSimpleTimer *)
           TPZFMatrix<double>::operator()
                     (this_00,(int64_t)in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10)
      ;
      *(double *)&in_stack_fffffffffffffc10->fName =
           in_stack_fffffffffffffc08 + *(double *)&in_stack_fffffffffffffc10->fName;
    }
  }
  TPZSimpleTimer::ReturnTimeDouble(in_stack_fffffffffffffc10);
  TPZStack<double,_10>::Push
            ((TPZStack<double,_10> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1f80acb);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1f80ad8);
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}